

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

double __thiscall doctest::detail::ResultBuilder::log(ResultBuilder *this,double __x)

{
  bool bVar1;
  size_type sVar2;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *this_00;
  reference ppIVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double dVar4;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  byte local_a9;
  IReporter **curr_rep;
  iterator __end3;
  iterator __begin3;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range3;
  String local_58;
  String local_40;
  String local_28;
  ResultBuilder *local_10;
  ResultBuilder *this_local;
  
  local_10 = this;
  if (((this->super_AssertData).m_at & is_throws) == 0) {
    if ((((this->super_AssertData).m_at & is_throws_as) == 0) ||
       (((this->super_AssertData).m_at & is_throws_with) == 0)) {
      if (((this->super_AssertData).m_at & is_throws_as) == 0) {
        if (((this->super_AssertData).m_at & is_throws_with) == 0) {
          if (((this->super_AssertData).m_at & is_nothrow) != 0) {
            (this->super_AssertData).m_failed = (bool)((this->super_AssertData).m_threw & 1);
          }
        }
        else {
          bVar1 = AssertData::StringContains::check
                            (&(this->super_AssertData).m_exception_string,
                             &(this->super_AssertData).m_exception);
          (this->super_AssertData).m_failed = (bool)((bVar1 ^ 0xffU) & 1);
        }
      }
      else {
        (this->super_AssertData).m_failed =
             (bool)(((this->super_AssertData).m_threw_as ^ 0xffU) & 1);
      }
    }
    else {
      local_a9 = 1;
      if (((this->super_AssertData).m_threw_as & 1U) != 0) {
        bVar1 = AssertData::StringContains::check
                          (&(this->super_AssertData).m_exception_string,
                           &(this->super_AssertData).m_exception);
        local_a9 = bVar1 ^ 0xff;
      }
      (this->super_AssertData).m_failed = (bool)(local_a9 & 1);
    }
  }
  else {
    (this->super_AssertData).m_failed = (bool)(((this->super_AssertData).m_threw ^ 0xffU) & 1);
  }
  sVar2 = String::size(&(this->super_AssertData).m_exception);
  dVar4 = extraout_XMM0_Qa;
  if (sVar2 != 0) {
    String::String(&local_58,"\"");
    operator+(&local_40,&local_58,&(this->super_AssertData).m_exception);
    String::String((String *)&__range3,"\"");
    operator+(&local_28,&local_40,(String *)&__range3);
    String::operator=(&(this->super_AssertData).m_exception,&local_28);
    String::~String(&local_28);
    String::~String((String *)&__range3);
    String::~String(&local_40);
    String::~String(&local_58);
    dVar4 = extraout_XMM0_Qa_00;
  }
  if ((is_running_in_test & 1) == 0) {
    if (((this->super_AssertData).m_failed & 1U) != 0) {
      failed_out_of_a_testing_context(&this->super_AssertData);
      dVar4 = extraout_XMM0_Qa_03;
    }
  }
  else {
    anon_unknown_15::addAssert((this->super_AssertData).m_at);
    this_00 = (vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)(g_cs + 0x10d0)
    ;
    __end3 = std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                       (this_00);
    curr_rep = (IReporter **)
               std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                         (this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                       *)&curr_rep), bVar1) {
      ppIVar3 = __gnu_cxx::
                __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                ::operator*(&__end3);
      (*(*ppIVar3)->_vptr_IReporter[9])(*ppIVar3,this);
      __gnu_cxx::
      __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
      ::operator++(&__end3);
    }
    dVar4 = extraout_XMM0_Qa_01;
    if (((this->super_AssertData).m_failed & 1U) != 0) {
      anon_unknown_15::addFailedAssert((this->super_AssertData).m_at);
      dVar4 = extraout_XMM0_Qa_02;
    }
  }
  if ((((this->super_AssertData).m_failed & 1U) != 0) &&
     (bVar1 = isDebuggerActive(), dVar4 = extraout_XMM0_Qa_04, bVar1)) {
    getContextOptions();
    dVar4 = extraout_XMM0_Qa_05;
  }
  return dVar4;
}

Assistant:

bool ResultBuilder::log() {
        if(m_at & assertType::is_throws) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw;
        } else if((m_at & assertType::is_throws_as) && (m_at & assertType::is_throws_with)) { //!OCLINT
            m_failed = !m_threw_as || !m_exception_string.check(m_exception);
        } else if(m_at & assertType::is_throws_as) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw_as;
        } else if(m_at & assertType::is_throws_with) { //!OCLINT bitwise operator in conditional
            m_failed = !m_exception_string.check(m_exception);
        } else if(m_at & assertType::is_nothrow) { //!OCLINT bitwise operator in conditional
            m_failed = m_threw;
        }

        if(m_exception.size())
            m_exception = "\"" + m_exception + "\"";

        if(is_running_in_test) {
            addAssert(m_at);
            DOCTEST_ITERATE_THROUGH_REPORTERS(log_assert, *this);

            if(m_failed)
                addFailedAssert(m_at);
        } else if(m_failed) {
            failed_out_of_a_testing_context(*this);
        }

        return m_failed && isDebuggerActive() && !getContextOptions()->no_breaks &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }